

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [32];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2851;
  undefined8 local_2850;
  float fStack_2848;
  float fStack_2844;
  undefined1 local_2840 [16];
  ulong local_2828;
  size_t local_2820;
  RayHitK<8> *local_2818;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  Scene *local_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [16];
  long local_27b0;
  ulong local_27a8;
  RTCFilterFunctionNArguments local_27a0;
  float local_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 *local_2740;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar26 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar15;
  local_24e0._0_4_ = uVar15;
  local_24e0._8_4_ = uVar15;
  local_24e0._12_4_ = uVar15;
  local_24e0._16_4_ = uVar15;
  local_24e0._20_4_ = uVar15;
  local_24e0._24_4_ = uVar15;
  local_24e0._28_4_ = uVar15;
  auVar79 = ZEXT3264(local_24e0);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar15;
  local_2500._0_4_ = uVar15;
  local_2500._8_4_ = uVar15;
  local_2500._12_4_ = uVar15;
  local_2500._16_4_ = uVar15;
  local_2500._20_4_ = uVar15;
  local_2500._24_4_ = uVar15;
  local_2500._28_4_ = uVar15;
  auVar80 = ZEXT3264(local_2500);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar15;
  local_2520._0_4_ = uVar15;
  local_2520._8_4_ = uVar15;
  local_2520._12_4_ = uVar15;
  local_2520._16_4_ = uVar15;
  local_2520._20_4_ = uVar15;
  local_2520._24_4_ = uVar15;
  local_2520._28_4_ = uVar15;
  auVar82 = ZEXT3264(local_2520);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar111 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar83 = fVar103 * 0.99999964;
  fVar93 = fVar111 * 0.99999964;
  fVar96 = fVar122 * 0.99999964;
  fVar103 = fVar103 * 1.0000004;
  fVar111 = fVar111 * 1.0000004;
  fVar122 = fVar122 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_27a8 = uVar25 ^ 0x20;
  iVar13 = (tray->tnear).field_0.i[k];
  local_26c0._4_4_ = iVar13;
  local_26c0._0_4_ = iVar13;
  local_26c0._8_4_ = iVar13;
  local_26c0._12_4_ = iVar13;
  local_26c0._16_4_ = iVar13;
  local_26c0._20_4_ = iVar13;
  local_26c0._24_4_ = iVar13;
  local_26c0._28_4_ = iVar13;
  auVar74 = ZEXT3264(local_26c0);
  iVar13 = (tray->tfar).field_0.i[k];
  auVar35 = ZEXT3264(CONCAT428(iVar13,CONCAT424(iVar13,CONCAT420(iVar13,CONCAT416(iVar13,CONCAT412(
                                                  iVar13,CONCAT48(iVar13,CONCAT44(iVar13,iVar13)))))
                                               )));
  iVar13 = 1 << ((uint)k & 0x1f);
  auVar45._4_4_ = iVar13;
  auVar45._0_4_ = iVar13;
  auVar45._8_4_ = iVar13;
  auVar45._12_4_ = iVar13;
  auVar45._16_4_ = iVar13;
  auVar45._20_4_ = iVar13;
  auVar45._24_4_ = iVar13;
  auVar45._28_4_ = iVar13;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar45 = vpand_avx2(auVar45,auVar7);
  local_2600 = vpcmpeqd_avx2(auVar45,auVar7);
  local_2540 = fVar83;
  fStack_253c = fVar83;
  fStack_2538 = fVar83;
  fStack_2534 = fVar83;
  fStack_2530 = fVar83;
  fStack_252c = fVar83;
  fStack_2528 = fVar83;
  fStack_2524 = fVar83;
  local_2560 = fVar93;
  fStack_255c = fVar93;
  fStack_2558 = fVar93;
  fStack_2554 = fVar93;
  fStack_2550 = fVar93;
  fStack_254c = fVar93;
  fStack_2548 = fVar93;
  fStack_2544 = fVar93;
  local_2580 = fVar96;
  fStack_257c = fVar96;
  fStack_2578 = fVar96;
  fStack_2574 = fVar96;
  fStack_2570 = fVar96;
  fStack_256c = fVar96;
  fStack_2568 = fVar96;
  fStack_2564 = fVar96;
  local_25a0 = fVar103;
  fStack_259c = fVar103;
  fStack_2598 = fVar103;
  fStack_2594 = fVar103;
  fStack_2590 = fVar103;
  fStack_258c = fVar103;
  fStack_2588 = fVar103;
  fStack_2584 = fVar103;
  local_25c0 = fVar111;
  fStack_25bc = fVar111;
  fStack_25b8 = fVar111;
  fStack_25b4 = fVar111;
  fStack_25b0 = fVar111;
  fStack_25ac = fVar111;
  fStack_25a8 = fVar111;
  fStack_25a4 = fVar111;
  local_25e0 = fVar122;
  fStack_25dc = fVar122;
  fStack_25d8 = fVar122;
  fStack_25d4 = fVar122;
  fStack_25d0 = fVar122;
  fStack_25cc = fVar122;
  fStack_25c8 = fVar122;
  fStack_25c4 = fVar122;
  fVar87 = fVar83;
  fVar88 = fVar83;
  fVar89 = fVar83;
  fVar90 = fVar83;
  fVar91 = fVar83;
  fVar92 = fVar83;
  fVar112 = fVar93;
  fVar114 = fVar93;
  fVar116 = fVar93;
  fVar118 = fVar93;
  fVar94 = fVar93;
  fVar95 = fVar93;
  fVar97 = fVar96;
  fVar98 = fVar96;
  fVar99 = fVar96;
  fVar100 = fVar96;
  fVar101 = fVar96;
  fVar102 = fVar96;
  fVar105 = fVar103;
  fVar106 = fVar103;
  fVar107 = fVar103;
  fVar108 = fVar103;
  fVar109 = fVar103;
  fVar110 = fVar103;
  fVar113 = fVar111;
  fVar115 = fVar111;
  fVar117 = fVar111;
  fVar119 = fVar111;
  fVar120 = fVar111;
  fVar121 = fVar111;
  fVar123 = fVar122;
  fVar124 = fVar122;
  fVar125 = fVar122;
  fVar126 = fVar122;
  fVar127 = fVar122;
  fVar128 = fVar122;
  local_2828 = uVar25;
  local_2820 = k;
  local_2818 = ray;
LAB_016c41a0:
  do {
    do {
      if (pauVar26 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar18 = pauVar26 + -1;
      pauVar26 = pauVar26 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar18 + 8));
    uVar19 = *(ulong *)*pauVar26;
    while ((uVar19 & 8) == 0) {
      auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar25),auVar79._0_32_);
      auVar7._4_4_ = fVar87 * auVar45._4_4_;
      auVar7._0_4_ = fVar83 * auVar45._0_4_;
      auVar7._8_4_ = fVar88 * auVar45._8_4_;
      auVar7._12_4_ = fVar89 * auVar45._12_4_;
      auVar7._16_4_ = fVar90 * auVar45._16_4_;
      auVar7._20_4_ = fVar91 * auVar45._20_4_;
      auVar7._24_4_ = fVar92 * auVar45._24_4_;
      auVar7._28_4_ = auVar45._28_4_;
      auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar24),auVar80._0_32_);
      auVar6._4_4_ = fVar112 * auVar45._4_4_;
      auVar6._0_4_ = fVar93 * auVar45._0_4_;
      auVar6._8_4_ = fVar114 * auVar45._8_4_;
      auVar6._12_4_ = fVar116 * auVar45._12_4_;
      auVar6._16_4_ = fVar118 * auVar45._16_4_;
      auVar6._20_4_ = fVar94 * auVar45._20_4_;
      auVar6._24_4_ = fVar95 * auVar45._24_4_;
      auVar6._28_4_ = auVar45._28_4_;
      auVar45 = vmaxps_avx(auVar7,auVar6);
      auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar22),auVar82._0_32_);
      auVar8._4_4_ = fVar97 * auVar7._4_4_;
      auVar8._0_4_ = fVar96 * auVar7._0_4_;
      auVar8._8_4_ = fVar98 * auVar7._8_4_;
      auVar8._12_4_ = fVar99 * auVar7._12_4_;
      auVar8._16_4_ = fVar100 * auVar7._16_4_;
      auVar8._20_4_ = fVar101 * auVar7._20_4_;
      auVar8._24_4_ = fVar102 * auVar7._24_4_;
      auVar8._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar8,auVar74._0_32_);
      auVar7 = vmaxps_avx(auVar45,auVar7);
      auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_27a8),auVar79._0_32_);
      auVar9._4_4_ = fVar105 * auVar45._4_4_;
      auVar9._0_4_ = fVar103 * auVar45._0_4_;
      auVar9._8_4_ = fVar106 * auVar45._8_4_;
      auVar9._12_4_ = fVar107 * auVar45._12_4_;
      auVar9._16_4_ = fVar108 * auVar45._16_4_;
      auVar9._20_4_ = fVar109 * auVar45._20_4_;
      auVar9._24_4_ = fVar110 * auVar45._24_4_;
      auVar9._28_4_ = auVar45._28_4_;
      auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar24 ^ 0x20)),auVar80._0_32_);
      auVar10._4_4_ = fVar113 * auVar45._4_4_;
      auVar10._0_4_ = fVar111 * auVar45._0_4_;
      auVar10._8_4_ = fVar115 * auVar45._8_4_;
      auVar10._12_4_ = fVar117 * auVar45._12_4_;
      auVar10._16_4_ = fVar119 * auVar45._16_4_;
      auVar10._20_4_ = fVar120 * auVar45._20_4_;
      auVar10._24_4_ = fVar121 * auVar45._24_4_;
      auVar10._28_4_ = auVar45._28_4_;
      auVar45 = vminps_avx(auVar9,auVar10);
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar22 ^ 0x20)),auVar82._0_32_);
      auVar11._4_4_ = fVar123 * auVar6._4_4_;
      auVar11._0_4_ = fVar122 * auVar6._0_4_;
      auVar11._8_4_ = fVar124 * auVar6._8_4_;
      auVar11._12_4_ = fVar125 * auVar6._12_4_;
      auVar11._16_4_ = fVar126 * auVar6._16_4_;
      auVar11._20_4_ = fVar127 * auVar6._20_4_;
      auVar11._24_4_ = fVar128 * auVar6._24_4_;
      auVar11._28_4_ = auVar6._28_4_;
      auVar6 = vminps_avx(auVar11,auVar35._0_32_);
      auVar45 = vminps_avx(auVar45,auVar6);
      auVar45 = vcmpps_avx(auVar7,auVar45,2);
      uVar14 = vmovmskps_avx(auVar45);
      local_24c0[0] = (RTCHitN)auVar7[0];
      local_24c0[1] = (RTCHitN)auVar7[1];
      local_24c0[2] = (RTCHitN)auVar7[2];
      local_24c0[3] = (RTCHitN)auVar7[3];
      local_24c0[4] = (RTCHitN)auVar7[4];
      local_24c0[5] = (RTCHitN)auVar7[5];
      local_24c0[6] = (RTCHitN)auVar7[6];
      local_24c0[7] = (RTCHitN)auVar7[7];
      local_24c0[8] = (RTCHitN)auVar7[8];
      local_24c0[9] = (RTCHitN)auVar7[9];
      local_24c0[10] = (RTCHitN)auVar7[10];
      local_24c0[0xb] = (RTCHitN)auVar7[0xb];
      local_24c0[0xc] = (RTCHitN)auVar7[0xc];
      local_24c0[0xd] = (RTCHitN)auVar7[0xd];
      local_24c0[0xe] = (RTCHitN)auVar7[0xe];
      local_24c0[0xf] = (RTCHitN)auVar7[0xf];
      local_24c0[0x10] = (RTCHitN)auVar7[0x10];
      local_24c0[0x11] = (RTCHitN)auVar7[0x11];
      local_24c0[0x12] = (RTCHitN)auVar7[0x12];
      local_24c0[0x13] = (RTCHitN)auVar7[0x13];
      local_24c0[0x14] = (RTCHitN)auVar7[0x14];
      local_24c0[0x15] = (RTCHitN)auVar7[0x15];
      local_24c0[0x16] = (RTCHitN)auVar7[0x16];
      local_24c0[0x17] = (RTCHitN)auVar7[0x17];
      local_24c0[0x18] = (RTCHitN)auVar7[0x18];
      local_24c0[0x19] = (RTCHitN)auVar7[0x19];
      local_24c0[0x1a] = (RTCHitN)auVar7[0x1a];
      local_24c0[0x1b] = (RTCHitN)auVar7[0x1b];
      local_24c0[0x1c] = (RTCHitN)auVar7[0x1c];
      local_24c0[0x1d] = (RTCHitN)auVar7[0x1d];
      local_24c0[0x1e] = (RTCHitN)auVar7[0x1e];
      local_24c0[0x1f] = (RTCHitN)auVar7[0x1f];
      if (uVar14 == 0) goto LAB_016c41a0;
      uVar14 = uVar14 & 0xff;
      uVar27 = uVar19 & 0xfffffffffffffff0;
      lVar20 = 0;
      for (uVar19 = (ulong)uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar19 = *(ulong *)(uVar27 + lVar20 * 8);
      uVar14 = uVar14 - 1 & uVar14;
      uVar16 = (ulong)uVar14;
      if (uVar14 != 0) {
        uVar3 = *(uint *)(local_24c0 + lVar20 * 4);
        lVar20 = 0;
        for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar14 = uVar14 - 1 & uVar14;
        uVar17 = (ulong)uVar14;
        uVar16 = *(ulong *)(uVar27 + lVar20 * 8);
        uVar4 = *(uint *)(local_24c0 + lVar20 * 4);
        if (uVar14 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar26 = uVar16;
            *(uint *)(*pauVar26 + 8) = uVar4;
            pauVar26 = pauVar26 + 1;
          }
          else {
            *(ulong *)*pauVar26 = uVar19;
            *(uint *)(*pauVar26 + 8) = uVar3;
            pauVar26 = pauVar26 + 1;
            uVar19 = uVar16;
          }
        }
        else {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar19;
          auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar16;
          auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar4));
          lVar20 = 0;
          for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar19 = (ulong)uVar14;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(uVar27 + lVar20 * 8);
          auVar37 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
          auVar54 = vpcmpgtd_avx(auVar47,auVar36);
          if (uVar14 == 0) {
            auVar64 = vpshufd_avx(auVar54,0xaa);
            auVar54 = vblendvps_avx(auVar47,auVar36,auVar64);
            auVar36 = vblendvps_avx(auVar36,auVar47,auVar64);
            auVar47 = vpcmpgtd_avx(auVar37,auVar54);
            auVar64 = vpshufd_avx(auVar47,0xaa);
            auVar47 = vblendvps_avx(auVar37,auVar54,auVar64);
            auVar54 = vblendvps_avx(auVar54,auVar37,auVar64);
            auVar37 = vpcmpgtd_avx(auVar54,auVar36);
            auVar64 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar54,auVar36,auVar64);
            auVar36 = vblendvps_avx(auVar36,auVar54,auVar64);
            *pauVar26 = auVar36;
            pauVar26[1] = auVar37;
            uVar19 = auVar47._0_8_;
            pauVar26 = pauVar26 + 2;
          }
          else {
            lVar20 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar19 = (ulong)uVar14;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(uVar27 + lVar20 * 8);
            auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
            if (uVar14 == 0) {
              auVar28 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar47,auVar36,auVar28);
              auVar36 = vblendvps_avx(auVar36,auVar47,auVar28);
              auVar47 = vpcmpgtd_avx(auVar64,auVar37);
              auVar28 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar64,auVar37,auVar28);
              auVar37 = vblendvps_avx(auVar37,auVar64,auVar28);
              auVar64 = vpcmpgtd_avx(auVar37,auVar36);
              auVar28 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar37,auVar36,auVar28);
              auVar36 = vblendvps_avx(auVar36,auVar37,auVar28);
              auVar37 = vpcmpgtd_avx(auVar47,auVar54);
              auVar28 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar47,auVar54,auVar28);
              auVar47 = vblendvps_avx(auVar54,auVar47,auVar28);
              auVar54 = vpcmpgtd_avx(auVar64,auVar47);
              auVar28 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar64,auVar47,auVar28);
              auVar47 = vblendvps_avx(auVar47,auVar64,auVar28);
              *pauVar26 = auVar36;
              pauVar26[1] = auVar47;
              pauVar26[2] = auVar54;
              uVar19 = auVar37._0_8_;
              pauVar18 = pauVar26 + 3;
            }
            else {
              *pauVar26 = auVar36;
              pauVar26[1] = auVar47;
              pauVar26[2] = auVar37;
              pauVar18 = pauVar26 + 3;
              pauVar26[3] = auVar64;
              do {
                lVar20 = 0;
                for (uVar25 = uVar19; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  lVar20 = lVar20 + 1;
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar27 + lVar20 * 8);
                auVar36 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
                pauVar18[1] = auVar36;
                pauVar18 = pauVar18 + 1;
                uVar19 = uVar19 - 1 & uVar19;
              } while (uVar19 != 0);
              lVar20 = 0;
              while (pauVar18 != pauVar26) {
                uVar15 = *(undefined4 *)pauVar26[1];
                uVar2 = *(undefined4 *)(pauVar26[1] + 4);
                uVar14 = *(uint *)(pauVar26[1] + 8);
                uVar12 = *(undefined4 *)(pauVar26[1] + 0xc);
                for (lVar23 = 0x10;
                    (lVar20 != lVar23 && (*(uint *)(pauVar26[-1] + lVar23 + 8) < uVar14));
                    lVar23 = lVar23 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar26 + lVar23) =
                       *(undefined1 (*) [16])(pauVar26[-1] + lVar23);
                }
                puVar1 = (undefined4 *)(*pauVar26 + lVar23);
                *puVar1 = uVar15;
                puVar1[1] = uVar2;
                puVar1[2] = uVar14;
                puVar1[3] = uVar12;
                lVar20 = lVar20 + -0x10;
                pauVar26 = pauVar26 + 1;
              }
              uVar19 = *(ulong *)*pauVar18;
              k = local_2820;
              ray = local_2818;
              uVar25 = local_2828;
            }
            auVar74 = ZEXT3264(local_26c0);
            pauVar26 = pauVar18;
          }
        }
      }
    }
    local_27b0 = (ulong)((uint)uVar19 & 0xf) - 8;
    uVar19 = uVar19 & 0xfffffffffffffff0;
    for (lVar20 = 0; lVar20 != local_27b0; lVar20 = lVar20 + 1) {
      lVar23 = lVar20 * 0xb0;
      uVar15 = *(undefined4 *)(ray + k * 4);
      auVar28._4_4_ = uVar15;
      auVar28._0_4_ = uVar15;
      auVar28._8_4_ = uVar15;
      auVar28._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar48._4_4_ = uVar15;
      auVar48._0_4_ = uVar15;
      auVar48._8_4_ = uVar15;
      auVar48._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar55._4_4_ = uVar15;
      auVar55._0_4_ = uVar15;
      auVar55._8_4_ = uVar15;
      auVar55._12_4_ = uVar15;
      local_27e0 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + lVar23),auVar28);
      local_27f0 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar23),auVar48);
      auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar23),auVar55);
      auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x30 + lVar23),auVar28);
      auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x40 + lVar23),auVar48);
      auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x50 + lVar23),auVar55);
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x60 + lVar23),auVar28);
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x70 + lVar23),auVar48);
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x80 + lVar23),auVar55);
      auVar48 = vsubps_avx(auVar64,local_27e0);
      local_2620 = vsubps_avx(auVar28,local_27f0);
      local_2610 = vsubps_avx(auVar39,auVar36);
      auVar29._0_4_ = local_27e0._0_4_ + auVar64._0_4_;
      auVar29._4_4_ = local_27e0._4_4_ + auVar64._4_4_;
      auVar29._8_4_ = local_27e0._8_4_ + auVar64._8_4_;
      auVar29._12_4_ = local_27e0._12_4_ + auVar64._12_4_;
      auVar56._0_4_ = local_27f0._0_4_ + auVar28._0_4_;
      auVar56._4_4_ = local_27f0._4_4_ + auVar28._4_4_;
      auVar56._8_4_ = local_27f0._8_4_ + auVar28._8_4_;
      auVar56._12_4_ = local_27f0._12_4_ + auVar28._12_4_;
      fVar112 = auVar36._0_4_;
      auVar59._0_4_ = fVar112 + auVar39._0_4_;
      fVar114 = auVar36._4_4_;
      auVar59._4_4_ = fVar114 + auVar39._4_4_;
      fVar116 = auVar36._8_4_;
      auVar59._8_4_ = fVar116 + auVar39._8_4_;
      fVar118 = auVar36._12_4_;
      auVar59._12_4_ = fVar118 + auVar39._12_4_;
      auVar104._0_4_ = local_2610._0_4_ * auVar56._0_4_;
      auVar104._4_4_ = local_2610._4_4_ * auVar56._4_4_;
      auVar104._8_4_ = local_2610._8_4_ * auVar56._8_4_;
      auVar104._12_4_ = local_2610._12_4_ * auVar56._12_4_;
      auVar38 = vfmsub231ps_fma(auVar104,local_2620,auVar59);
      auVar60._0_4_ = auVar59._0_4_ * auVar48._0_4_;
      auVar60._4_4_ = auVar59._4_4_ * auVar48._4_4_;
      auVar60._8_4_ = auVar59._8_4_ * auVar48._8_4_;
      auVar60._12_4_ = auVar59._12_4_ * auVar48._12_4_;
      auVar55 = vfmsub231ps_fma(auVar60,local_2610,auVar29);
      auVar30._0_4_ = local_2620._0_4_ * auVar29._0_4_;
      auVar30._4_4_ = local_2620._4_4_ * auVar29._4_4_;
      auVar30._8_4_ = local_2620._8_4_ * auVar29._8_4_;
      auVar30._12_4_ = local_2620._12_4_ * auVar29._12_4_;
      auVar29 = vfmsub231ps_fma(auVar30,auVar48,auVar56);
      local_2850._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar57._0_4_ = local_2850._4_4_ * auVar29._0_4_;
      auVar57._4_4_ = local_2850._4_4_ * auVar29._4_4_;
      auVar57._8_4_ = local_2850._4_4_ * auVar29._8_4_;
      auVar57._12_4_ = local_2850._4_4_ * auVar29._12_4_;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar81._4_4_ = uVar15;
      auVar81._0_4_ = uVar15;
      auVar81._8_4_ = uVar15;
      auVar81._12_4_ = uVar15;
      auVar55 = vfmadd231ps_fma(auVar57,auVar81,auVar55);
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_2840._4_4_ = uVar15;
      local_2840._0_4_ = uVar15;
      local_2840._8_4_ = uVar15;
      local_2840._12_4_ = uVar15;
      local_2660 = vfmadd231ps_fma(auVar55,local_2840,auVar38);
      local_2630 = vsubps_avx(local_27f0,auVar54);
      local_2640 = vsubps_avx(auVar36,auVar37);
      auVar65._0_4_ = auVar54._0_4_ + local_27f0._0_4_;
      auVar65._4_4_ = auVar54._4_4_ + local_27f0._4_4_;
      auVar65._8_4_ = auVar54._8_4_ + local_27f0._8_4_;
      auVar65._12_4_ = auVar54._12_4_ + local_27f0._12_4_;
      auVar61._0_4_ = fVar112 + auVar37._0_4_;
      auVar61._4_4_ = fVar114 + auVar37._4_4_;
      auVar61._8_4_ = fVar116 + auVar37._8_4_;
      auVar61._12_4_ = fVar118 + auVar37._12_4_;
      fVar103 = local_2640._0_4_;
      auVar68._0_4_ = auVar65._0_4_ * fVar103;
      fVar83 = local_2640._4_4_;
      auVar68._4_4_ = auVar65._4_4_ * fVar83;
      fVar87 = local_2640._8_4_;
      auVar68._8_4_ = auVar65._8_4_ * fVar87;
      fVar90 = local_2640._12_4_;
      auVar68._12_4_ = auVar65._12_4_ * fVar90;
      auVar55 = vfmsub231ps_fma(auVar68,local_2630,auVar61);
      local_2650 = vsubps_avx(local_27e0,auVar47);
      fVar111 = local_2650._0_4_;
      auVar75._0_4_ = auVar61._0_4_ * fVar111;
      fVar93 = local_2650._4_4_;
      auVar75._4_4_ = auVar61._4_4_ * fVar93;
      fVar88 = local_2650._8_4_;
      auVar75._8_4_ = auVar61._8_4_ * fVar88;
      fVar91 = local_2650._12_4_;
      auVar75._12_4_ = auVar61._12_4_ * fVar91;
      auVar62._0_4_ = local_27e0._0_4_ + auVar47._0_4_;
      auVar62._4_4_ = local_27e0._4_4_ + auVar47._4_4_;
      auVar62._8_4_ = local_27e0._8_4_ + auVar47._8_4_;
      auVar62._12_4_ = local_27e0._12_4_ + auVar47._12_4_;
      auVar36 = vfmsub231ps_fma(auVar75,local_2640,auVar62);
      fVar122 = local_2630._0_4_;
      auVar63._0_4_ = auVar62._0_4_ * fVar122;
      fVar96 = local_2630._4_4_;
      auVar63._4_4_ = auVar62._4_4_ * fVar96;
      fVar89 = local_2630._8_4_;
      auVar63._8_4_ = auVar62._8_4_ * fVar89;
      fVar92 = local_2630._12_4_;
      auVar63._12_4_ = auVar62._12_4_ * fVar92;
      auVar38 = vfmsub231ps_fma(auVar63,local_2650,auVar65);
      auVar31._0_4_ = local_2850._4_4_ * auVar38._0_4_;
      auVar31._4_4_ = local_2850._4_4_ * auVar38._4_4_;
      auVar31._8_4_ = local_2850._4_4_ * auVar38._8_4_;
      auVar31._12_4_ = local_2850._4_4_ * auVar38._12_4_;
      auVar36 = vfmadd231ps_fma(auVar31,auVar81,auVar36);
      local_2760 = vfmadd231ps_fma(auVar36,local_2840,auVar55);
      auVar55 = vsubps_avx(auVar47,auVar64);
      auVar69._0_4_ = auVar47._0_4_ + auVar64._0_4_;
      auVar69._4_4_ = auVar47._4_4_ + auVar64._4_4_;
      auVar69._8_4_ = auVar47._8_4_ + auVar64._8_4_;
      auVar69._12_4_ = auVar47._12_4_ + auVar64._12_4_;
      auVar64 = vsubps_avx(auVar54,auVar28);
      auVar49._0_4_ = auVar54._0_4_ + auVar28._0_4_;
      auVar49._4_4_ = auVar54._4_4_ + auVar28._4_4_;
      auVar49._8_4_ = auVar54._8_4_ + auVar28._8_4_;
      auVar49._12_4_ = auVar54._12_4_ + auVar28._12_4_;
      auVar54 = vsubps_avx(auVar37,auVar39);
      auVar38._0_4_ = auVar37._0_4_ + auVar39._0_4_;
      auVar38._4_4_ = auVar37._4_4_ + auVar39._4_4_;
      auVar38._8_4_ = auVar37._8_4_ + auVar39._8_4_;
      auVar38._12_4_ = auVar37._12_4_ + auVar39._12_4_;
      auVar66._0_4_ = auVar54._0_4_ * auVar49._0_4_;
      auVar66._4_4_ = auVar54._4_4_ * auVar49._4_4_;
      auVar66._8_4_ = auVar54._8_4_ * auVar49._8_4_;
      auVar66._12_4_ = auVar54._12_4_ * auVar49._12_4_;
      auVar47 = vfmsub231ps_fma(auVar66,auVar64,auVar38);
      auVar39._0_4_ = auVar38._0_4_ * auVar55._0_4_;
      auVar39._4_4_ = auVar38._4_4_ * auVar55._4_4_;
      auVar39._8_4_ = auVar38._8_4_ * auVar55._8_4_;
      auVar39._12_4_ = auVar38._12_4_ * auVar55._12_4_;
      auVar36 = vfmsub231ps_fma(auVar39,auVar54,auVar69);
      auVar70._0_4_ = auVar64._0_4_ * auVar69._0_4_;
      auVar70._4_4_ = auVar64._4_4_ * auVar69._4_4_;
      auVar70._8_4_ = auVar64._8_4_ * auVar69._8_4_;
      auVar70._12_4_ = auVar64._12_4_ * auVar69._12_4_;
      auVar37 = vfmsub231ps_fma(auVar70,auVar55,auVar49);
      local_2850._0_4_ = local_2850._4_4_;
      fStack_2848 = local_2850._4_4_;
      fStack_2844 = local_2850._4_4_;
      auVar50._0_4_ = local_2850._4_4_ * auVar37._0_4_;
      auVar50._4_4_ = local_2850._4_4_ * auVar37._4_4_;
      auVar50._8_4_ = local_2850._4_4_ * auVar37._8_4_;
      auVar50._12_4_ = local_2850._4_4_ * auVar37._12_4_;
      auVar36 = vfmadd231ps_fma(auVar50,auVar81,auVar36);
      auVar37 = vfmadd231ps_fma(auVar36,local_2840,auVar47);
      local_2770 = local_2660._0_4_;
      fStack_276c = local_2660._4_4_;
      fStack_2768 = local_2660._8_4_;
      fStack_2764 = local_2660._12_4_;
      local_2750._0_4_ = auVar37._0_4_ + local_2760._0_4_ + local_2770;
      local_2750._4_4_ = auVar37._4_4_ + local_2760._4_4_ + fStack_276c;
      local_2750._8_4_ = auVar37._8_4_ + local_2760._8_4_ + fStack_2768;
      local_2750._12_4_ = auVar37._12_4_ + local_2760._12_4_ + fStack_2764;
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar36 = vminps_avx(local_2660,local_2760);
      auVar36 = vminps_avx(auVar36,auVar37);
      local_2670 = vandps_avx(local_2750,auVar67);
      auVar76._0_4_ = local_2670._0_4_ * 1.1920929e-07;
      auVar76._4_4_ = local_2670._4_4_ * 1.1920929e-07;
      auVar76._8_4_ = local_2670._8_4_ * 1.1920929e-07;
      auVar76._12_4_ = local_2670._12_4_ * 1.1920929e-07;
      uVar27 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
      auVar71._0_8_ = uVar27 ^ 0x8000000080000000;
      auVar71._8_4_ = -auVar76._8_4_;
      auVar71._12_4_ = -auVar76._12_4_;
      auVar36 = vcmpps_avx(auVar36,auVar71,5);
      auVar47 = vmaxps_avx(local_2660,local_2760);
      auVar47 = vmaxps_avx(auVar47,auVar37);
      auVar47 = vcmpps_avx(auVar47,auVar76,2);
      auVar36 = vorps_avx(auVar36,auVar47);
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        auVar51._0_4_ = fVar122 * local_2610._0_4_;
        auVar51._4_4_ = fVar96 * local_2610._4_4_;
        auVar51._8_4_ = fVar89 * local_2610._8_4_;
        auVar51._12_4_ = fVar92 * local_2610._12_4_;
        auVar72._0_4_ = fVar111 * local_2620._0_4_;
        auVar72._4_4_ = fVar93 * local_2620._4_4_;
        auVar72._8_4_ = fVar88 * local_2620._8_4_;
        auVar72._12_4_ = fVar91 * local_2620._12_4_;
        auVar37 = vfmsub213ps_fma(local_2620,local_2640,auVar51);
        auVar77._0_4_ = auVar64._0_4_ * fVar103;
        auVar77._4_4_ = auVar64._4_4_ * fVar83;
        auVar77._8_4_ = auVar64._8_4_ * fVar87;
        auVar77._12_4_ = auVar64._12_4_ * fVar90;
        auVar40._0_4_ = fVar111 * auVar54._0_4_;
        auVar40._4_4_ = fVar93 * auVar54._4_4_;
        auVar40._8_4_ = fVar88 * auVar54._8_4_;
        auVar40._12_4_ = fVar91 * auVar54._12_4_;
        auVar28 = vfmsub213ps_fma(auVar54,local_2630,auVar77);
        auVar47 = vandps_avx(auVar51,auVar67);
        auVar54 = vandps_avx(auVar77,auVar67);
        auVar47 = vcmpps_avx(auVar47,auVar54,1);
        local_26f0 = vblendvps_avx(auVar28,auVar37,auVar47);
        auVar78._0_4_ = fVar122 * auVar55._0_4_;
        auVar78._4_4_ = fVar96 * auVar55._4_4_;
        auVar78._8_4_ = fVar89 * auVar55._8_4_;
        auVar78._12_4_ = fVar92 * auVar55._12_4_;
        auVar37 = vfmsub213ps_fma(auVar55,local_2640,auVar40);
        auVar84._0_4_ = auVar48._0_4_ * fVar103;
        auVar84._4_4_ = auVar48._4_4_ * fVar83;
        auVar84._8_4_ = auVar48._8_4_ * fVar87;
        auVar84._12_4_ = auVar48._12_4_ * fVar90;
        auVar28 = vfmsub213ps_fma(local_2610,local_2650,auVar84);
        auVar47 = vandps_avx(auVar84,auVar67);
        auVar54 = vandps_avx(auVar40,auVar67);
        auVar47 = vcmpps_avx(auVar47,auVar54,1);
        local_26e0 = vblendvps_avx(auVar37,auVar28,auVar47);
        auVar37 = vfmsub213ps_fma(auVar48,local_2630,auVar72);
        auVar64 = vfmsub213ps_fma(auVar64,local_2650,auVar78);
        auVar47 = vandps_avx(auVar72,auVar67);
        auVar54 = vandps_avx(auVar78,auVar67);
        auVar47 = vcmpps_avx(auVar47,auVar54,1);
        local_26d0 = vblendvps_avx(auVar64,auVar37,auVar47);
        auVar41._0_4_ = local_26d0._0_4_ * local_2850._4_4_;
        auVar41._4_4_ = local_26d0._4_4_ * local_2850._4_4_;
        auVar41._8_4_ = local_26d0._8_4_ * local_2850._4_4_;
        auVar41._12_4_ = local_26d0._12_4_ * local_2850._4_4_;
        auVar47 = vfmadd213ps_fma(auVar81,local_26e0,auVar41);
        auVar47 = vfmadd213ps_fma(local_2840,local_26f0,auVar47);
        auVar73._0_4_ = auVar47._0_4_ + auVar47._0_4_;
        auVar73._4_4_ = auVar47._4_4_ + auVar47._4_4_;
        auVar73._8_4_ = auVar47._8_4_ + auVar47._8_4_;
        auVar73._12_4_ = auVar47._12_4_ + auVar47._12_4_;
        auVar42._0_4_ = local_26d0._0_4_ * fVar112;
        auVar42._4_4_ = local_26d0._4_4_ * fVar114;
        auVar42._8_4_ = local_26d0._8_4_ * fVar116;
        auVar42._12_4_ = local_26d0._12_4_ * fVar118;
        auVar47 = vfmadd213ps_fma(local_27f0,local_26e0,auVar42);
        auVar54 = vfmadd213ps_fma(local_27e0,local_26f0,auVar47);
        auVar47 = vrcpps_avx(auVar73);
        auVar85._8_4_ = 0x3f800000;
        auVar85._0_8_ = 0x3f8000003f800000;
        auVar85._12_4_ = 0x3f800000;
        auVar37 = vfnmadd213ps_fma(auVar47,auVar73,auVar85);
        auVar47 = vfmadd132ps_fma(auVar37,auVar47,auVar47);
        local_2700._0_4_ = auVar47._0_4_ * (auVar54._0_4_ + auVar54._0_4_);
        local_2700._4_4_ = auVar47._4_4_ * (auVar54._4_4_ + auVar54._4_4_);
        local_2700._8_4_ = auVar47._8_4_ * (auVar54._8_4_ + auVar54._8_4_);
        local_2700._12_4_ = auVar47._12_4_ * (auVar54._12_4_ + auVar54._12_4_);
        auVar35 = ZEXT1664(local_2700);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar43._4_4_ = uVar15;
        auVar43._0_4_ = uVar15;
        auVar43._8_4_ = uVar15;
        auVar43._12_4_ = uVar15;
        auVar47 = vcmpps_avx(auVar43,local_2700,2);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar86._4_4_ = uVar15;
        auVar86._0_4_ = uVar15;
        auVar86._8_4_ = uVar15;
        auVar86._12_4_ = uVar15;
        auVar74 = ZEXT1664(auVar86);
        auVar54 = vcmpps_avx(local_2700,auVar86,2);
        auVar47 = vandps_avx(auVar47,auVar54);
        auVar54 = auVar36 & auVar47;
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          auVar54 = vandps_avx(auVar47,auVar36);
          auVar37 = vcmpps_avx(auVar73,_DAT_01f45a50,4);
          auVar64 = auVar37 & auVar54;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            local_27c0 = vandps_avx(auVar54,auVar37);
            local_2740 = &local_2851;
            uStack_27c8 = auVar36._8_8_;
            local_27d0 = context->scene;
            auVar36 = vrcpps_avx(local_2750);
            auVar58._8_4_ = 0x3f800000;
            auVar58._0_8_ = 0x3f8000003f800000;
            auVar58._12_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_fma(local_2750,auVar36,auVar58);
            auVar54 = vfmadd132ps_fma(auVar54,auVar36,auVar36);
            auVar52._8_4_ = 0x219392ef;
            auVar52._0_8_ = 0x219392ef219392ef;
            auVar52._12_4_ = 0x219392ef;
            auVar36 = vcmpps_avx(local_2670,auVar52,5);
            auVar36 = vandps_avx(auVar54,auVar36);
            auVar32._0_4_ = local_2770 * auVar36._0_4_;
            auVar32._4_4_ = fStack_276c * auVar36._4_4_;
            auVar32._8_4_ = fStack_2768 * auVar36._8_4_;
            auVar32._12_4_ = fStack_2764 * auVar36._12_4_;
            local_2720 = vminps_avx(auVar32,auVar58);
            auVar33._0_4_ = local_2760._0_4_ * auVar36._0_4_;
            auVar33._4_4_ = local_2760._4_4_ * auVar36._4_4_;
            auVar33._8_4_ = local_2760._8_4_ * auVar36._8_4_;
            auVar33._12_4_ = local_2760._12_4_ * auVar36._12_4_;
            local_2710 = vminps_avx(auVar33,auVar58);
            auVar53._8_4_ = 0x7f800000;
            auVar53._0_8_ = 0x7f8000007f800000;
            auVar53._12_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar53,local_2700,local_27c0);
            auVar54 = vshufps_avx(auVar36,auVar36,0xb1);
            auVar54 = vminps_avx(auVar54,auVar36);
            auVar37 = vshufpd_avx(auVar54,auVar54,1);
            auVar54 = vminps_avx(auVar37,auVar54);
            auVar36 = vcmpps_avx(auVar36,auVar54,0);
            auVar37 = local_27c0 & auVar36;
            auVar54 = vpcmpeqd_avx(auVar54,auVar54);
            if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar37[0xf] < '\0') {
              auVar54 = auVar36;
            }
            lVar23 = lVar23 + uVar19;
            auVar36 = vandps_avx(local_27c0,auVar54);
            uVar15 = vmovmskps_avx(auVar36);
            lVar21 = 0;
            for (uVar27 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar15); (uVar27 & 1) == 0;
                uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            auVar45 = vpcmpeqd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar47));
            auVar79 = ZEXT3264(auVar45);
            local_2850 = lVar23;
            local_2730 = local_27c0;
            do {
              uVar14 = *(uint *)(lVar23 + 0x90 + lVar21 * 4);
              uVar27 = (ulong)uVar14;
              lVar23 = *(long *)(*(long *)((long)local_27d0 + 0x1e8) + uVar27 * 8);
              local_2840._0_8_ = lVar23;
              if ((*(uint *)(lVar23 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_27c0 + lVar21 * 4) = 0;
                lVar23 = local_2850;
              }
              else {
                local_27e0._0_8_ = lVar21;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar23 + 0x40) == 0)) {
                  uVar15 = *(undefined4 *)(local_2720 + lVar21 * 4);
                  uVar2 = *(undefined4 *)(local_2710 + lVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26f0 + lVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26e0 + lVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26d0 + lVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar15;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(local_2850 + 0xa0 + lVar21 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar14;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_2460 = *(undefined4 *)(local_2720 + lVar21 * 4);
                local_2440 = *(undefined4 *)(local_2710 + lVar21 * 4);
                uVar15 = *(undefined4 *)(local_2850 + 0xa0 + lVar21 * 4);
                local_2420._4_4_ = uVar15;
                local_2420._0_4_ = uVar15;
                local_2420._8_4_ = uVar15;
                local_2420._12_4_ = uVar15;
                local_2420._16_4_ = uVar15;
                local_2420._20_4_ = uVar15;
                local_2420._24_4_ = uVar15;
                local_2420._28_4_ = uVar15;
                uVar15 = *(undefined4 *)(local_26f0 + lVar21 * 4);
                uVar2 = *(undefined4 *)(local_26e0 + lVar21 * 4);
                local_24a0._4_4_ = uVar2;
                local_24a0._0_4_ = uVar2;
                local_24a0._8_4_ = uVar2;
                local_24a0._12_4_ = uVar2;
                local_24a0._16_4_ = uVar2;
                local_24a0._20_4_ = uVar2;
                local_24a0._24_4_ = uVar2;
                local_24a0._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_26d0 + lVar21 * 4);
                local_2480._4_4_ = uVar2;
                local_2480._0_4_ = uVar2;
                local_2480._8_4_ = uVar2;
                local_2480._12_4_ = uVar2;
                local_2480._16_4_ = uVar2;
                local_2480._20_4_ = uVar2;
                local_2480._24_4_ = uVar2;
                local_2480._28_4_ = uVar2;
                local_2400._4_4_ = uVar14;
                local_2400._0_4_ = uVar14;
                local_2400._8_4_ = uVar14;
                local_2400._12_4_ = uVar14;
                local_2400._16_4_ = uVar14;
                local_2400._20_4_ = uVar14;
                local_2400._24_4_ = uVar14;
                local_2400._28_4_ = uVar14;
                local_24c0[0] = (RTCHitN)(char)uVar15;
                local_24c0[1] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[2] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[3] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[4] = (RTCHitN)(char)uVar15;
                local_24c0[5] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[6] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[7] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[8] = (RTCHitN)(char)uVar15;
                local_24c0[9] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[10] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0xb] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0xc] = (RTCHitN)(char)uVar15;
                local_24c0[0xd] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0xe] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0xf] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x10] = (RTCHitN)(char)uVar15;
                local_24c0[0x11] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x12] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x13] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x14] = (RTCHitN)(char)uVar15;
                local_24c0[0x15] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x16] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x17] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x18] = (RTCHitN)(char)uVar15;
                local_24c0[0x19] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x1c] = (RTCHitN)(char)uVar15;
                local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                uStack_245c = local_2460;
                uStack_2458 = local_2460;
                uStack_2454 = local_2460;
                uStack_2450 = local_2460;
                uStack_244c = local_2460;
                uStack_2448 = local_2460;
                uStack_2444 = local_2460;
                uStack_243c = local_2440;
                uStack_2438 = local_2440;
                uStack_2434 = local_2440;
                uStack_2430 = local_2440;
                uStack_242c = local_2440;
                uStack_2428 = local_2440;
                uStack_2424 = local_2440;
                uStack_23dc = context->user->instID[0];
                local_23e0 = uStack_23dc;
                uStack_23d8 = uStack_23dc;
                uStack_23d4 = uStack_23dc;
                uStack_23d0 = uStack_23dc;
                uStack_23cc = uStack_23dc;
                uStack_23c8 = uStack_23dc;
                uStack_23c4 = uStack_23dc;
                uStack_23bc = context->user->instPrimID[0];
                local_23c0 = uStack_23bc;
                uStack_23b8 = uStack_23bc;
                uStack_23b4 = uStack_23bc;
                uStack_23b0 = uStack_23bc;
                uStack_23ac = uStack_23bc;
                uStack_23a8 = uStack_23bc;
                uStack_23a4 = uStack_23bc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar21 * 4);
                local_26a0 = local_2600;
                local_27a0.valid = (int *)local_26a0;
                local_27a0.geometryUserPtr = *(void **)(lVar23 + 0x18);
                local_27a0.context = context->user;
                local_27a0.hit = local_24c0;
                local_27a0.N = 8;
                local_27a0.ray = (RTCRayN *)ray;
                if (*(code **)(lVar23 + 0x40) != (code *)0x0) {
                  local_27f0._0_8_ = lVar20;
                  local_2800 = auVar35._0_16_;
                  local_2810 = auVar74._0_16_;
                  auVar45 = ZEXT1632(auVar79._0_16_);
                  (**(code **)(lVar23 + 0x40))(&local_27a0);
                  auVar74 = ZEXT1664(local_2810);
                  auVar35 = ZEXT1664(local_2800);
                  auVar45 = vpcmpeqd_avx2(auVar45,auVar45);
                  auVar79 = ZEXT3264(auVar45);
                  lVar20 = local_27f0._0_8_;
                  k = local_2820;
                  ray = local_2818;
                  uVar25 = local_2828;
                }
                auVar7 = vpcmpeqd_avx2(local_26a0,_DAT_01f7b000);
                auVar45 = auVar79._0_32_ & ~auVar7;
                if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar45 >> 0x7f,0) == '\0') &&
                      (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar45 >> 0xbf,0) == '\0') &&
                    (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar45[0x1f]) {
                  auVar7 = auVar7 ^ auVar79._0_32_;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_2840._0_8_ + 0x3e) & 0x40) != 0)))) {
                    local_27f0._0_8_ = lVar20;
                    local_2800 = auVar35._0_16_;
                    local_2810 = auVar74._0_16_;
                    auVar45 = ZEXT1632(auVar79._0_16_);
                    (*p_Var5)(&local_27a0);
                    auVar74 = ZEXT1664(local_2810);
                    auVar35 = ZEXT1664(local_2800);
                    auVar45 = vpcmpeqd_avx2(auVar45,auVar45);
                    auVar79 = ZEXT3264(auVar45);
                    lVar20 = local_27f0._0_8_;
                    k = local_2820;
                    ray = local_2818;
                    uVar25 = local_2828;
                  }
                  auVar6 = vpcmpeqd_avx2(local_26a0,_DAT_01f7b000);
                  auVar7 = auVar6 ^ auVar79._0_32_;
                  auVar45 = auVar79._0_32_ & ~auVar6;
                  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar45 >> 0x7f,0) != '\0') ||
                        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar45 >> 0xbf,0) != '\0') ||
                      (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar45[0x1f] < '\0') {
                    auVar46._0_4_ = auVar6._0_4_ ^ auVar79._0_4_;
                    auVar46._4_4_ = auVar6._4_4_ ^ auVar79._4_4_;
                    auVar46._8_4_ = auVar6._8_4_ ^ auVar79._8_4_;
                    auVar46._12_4_ = auVar6._12_4_ ^ auVar79._12_4_;
                    auVar46._16_4_ = auVar6._16_4_ ^ auVar79._16_4_;
                    auVar46._20_4_ = auVar6._20_4_ ^ auVar79._20_4_;
                    auVar46._24_4_ = auVar6._24_4_ ^ auVar79._24_4_;
                    auVar46._28_4_ = auVar6._28_4_ ^ auVar79._28_4_;
                    auVar45 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])local_27a0.hit);
                    *(undefined1 (*) [32])(local_27a0.ray + 0x180) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0x20));
                    *(undefined1 (*) [32])(local_27a0.ray + 0x1a0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0x40));
                    *(undefined1 (*) [32])(local_27a0.ray + 0x1c0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0x60));
                    *(undefined1 (*) [32])(local_27a0.ray + 0x1e0) = auVar45;
                    auVar45 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0x80));
                    *(undefined1 (*) [32])(local_27a0.ray + 0x200) = auVar45;
                    auVar45 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_27a0.ray + 0x220) = auVar45;
                    auVar45 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_27a0.ray + 0x240) = auVar45;
                    auVar45 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_27a0.ray + 0x260) = auVar45;
                    auVar45 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_27a0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_27a0.ray + 0x280) = auVar45;
                  }
                }
                if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar7 >> 0x7f,0) == '\0') &&
                      (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0xbf,0) == '\0') &&
                    (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar7[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar74._0_4_;
                }
                else {
                  auVar74 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_27c0 + local_27e0._0_8_ * 4) = 0;
                uVar15 = auVar74._0_4_;
                auVar34._4_4_ = uVar15;
                auVar34._0_4_ = uVar15;
                auVar34._8_4_ = uVar15;
                auVar34._12_4_ = uVar15;
                auVar36 = vcmpps_avx(auVar35._0_16_,auVar34,2);
                local_27c0 = vandps_avx(auVar36,local_27c0);
                uVar27 = local_27e0._0_8_;
                lVar23 = local_2850;
              }
              if ((((local_27c0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_27c0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_27c0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_27c0[0xf]) break;
              auVar44._8_4_ = 0x7f800000;
              auVar44._0_8_ = 0x7f8000007f800000;
              auVar44._12_4_ = 0x7f800000;
              auVar36 = vblendvps_avx(auVar44,auVar35._0_16_,local_27c0);
              auVar47 = vshufps_avx(auVar36,auVar36,0xb1);
              auVar47 = vminps_avx(auVar47,auVar36);
              auVar54 = vshufpd_avx(auVar47,auVar47,1);
              auVar47 = vminps_avx(auVar54,auVar47);
              auVar47 = vcmpps_avx(auVar36,auVar47,0);
              auVar54 = local_27c0 & auVar47;
              auVar36 = local_27c0;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar36 = vandps_avx(auVar47,local_27c0);
              }
              uVar15 = vmovmskps_avx(auVar36);
              lVar21 = 0;
              for (uVar27 = CONCAT44((int)(uVar27 >> 0x20),uVar15); (uVar27 & 1) == 0;
                  uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
            } while( true );
          }
        }
      }
      auVar79 = ZEXT3264(local_24e0);
      auVar80 = ZEXT3264(local_2500);
      auVar82 = ZEXT3264(local_2520);
      auVar74 = ZEXT3264(local_26c0);
      fVar83 = local_2540;
      fVar87 = fStack_253c;
      fVar88 = fStack_2538;
      fVar89 = fStack_2534;
      fVar90 = fStack_2530;
      fVar91 = fStack_252c;
      fVar92 = fStack_2528;
      fVar93 = local_2560;
      fVar112 = fStack_255c;
      fVar114 = fStack_2558;
      fVar116 = fStack_2554;
      fVar118 = fStack_2550;
      fVar94 = fStack_254c;
      fVar95 = fStack_2548;
      fVar96 = local_2580;
      fVar97 = fStack_257c;
      fVar98 = fStack_2578;
      fVar99 = fStack_2574;
      fVar100 = fStack_2570;
      fVar101 = fStack_256c;
      fVar102 = fStack_2568;
      fVar103 = local_25a0;
      fVar105 = fStack_259c;
      fVar106 = fStack_2598;
      fVar107 = fStack_2594;
      fVar108 = fStack_2590;
      fVar109 = fStack_258c;
      fVar110 = fStack_2588;
      fVar111 = local_25c0;
      fVar113 = fStack_25bc;
      fVar115 = fStack_25b8;
      fVar117 = fStack_25b4;
      fVar119 = fStack_25b0;
      fVar120 = fStack_25ac;
      fVar121 = fStack_25a8;
      fVar122 = local_25e0;
      fVar123 = fStack_25dc;
      fVar124 = fStack_25d8;
      fVar125 = fStack_25d4;
      fVar126 = fStack_25d0;
      fVar127 = fStack_25cc;
      fVar128 = fStack_25c8;
    }
    uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar35 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,CONCAT412
                                                  (uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }